

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Id __thiscall spv::Builder::getCooperativeVectorNumComponents(Builder *this,Id typeId)

{
  Id IVar1;
  
  IVar1 = Instruction::getIdOperand
                    ((this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[typeId],1);
  return IVar1;
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }